

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedBlackTree.cpp
# Opt level: O3

int __thiscall RedBlackTree::containsElement(RedBlackTree *this,int value)

{
  int iVar1;
  
  if (this->root != (Node *)0x0) {
    iVar1 = -1;
    if (this->root->value == value) {
      iVar1 = value;
    }
    return iVar1;
  }
  return -1;
}

Assistant:

int RedBlackTree::find(Node *&root, int value) {
    if (root == nullptr) {
        return -1;
    }
    if (value == root->value) {
        return value;
    } else if (value < root->value) {
        find(root->left, value);
    } else if (value > root->value) {
        find(root->right, value);
    }
    return -1;
}